

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall V1Transport::readData(V1Transport *this,Span<const_unsigned_char> msg_bytes)

{
  uint uVar1;
  Span<const_unsigned_char> input;
  uint *puVar2;
  size_type sVar3;
  Span<const_unsigned_char> *this_00;
  reference __dest;
  uchar *__src;
  long in_RDI;
  long in_FS_OFFSET;
  uint nCopy;
  uint nRemaining;
  Span<const_unsigned_char> *in_stack_ffffffffffffff88;
  DataStream *in_stack_ffffffffffffff90;
  undefined1 *count;
  DataStream *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  size_t in_stack_ffffffffffffffa8;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            ((char *)in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90,
             (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),(AnnotatedMixin<std::mutex> *)0xffa47b)
  ;
  Span<const_unsigned_char>::size(in_stack_ffffffffffffff88);
  puVar2 = std::min<unsigned_int>
                     ((uint *)in_stack_ffffffffffffff90,(uint *)in_stack_ffffffffffffff88);
  uVar1 = *puVar2;
  sVar3 = DataStream::size(in_stack_ffffffffffffff98);
  if (sVar3 < *(int *)(in_RDI + 300) + uVar1) {
    in_stack_ffffffffffffffa8 = in_RDI + 0x108;
    std::min<unsigned_int>((uint *)in_stack_ffffffffffffff90,(uint *)in_stack_ffffffffffffff88);
    DataStream::resize(in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88,
                       (value_type)((ulong)in_stack_ffffffffffffff98 >> 0x38));
  }
  this_00 = (Span<const_unsigned_char> *)(in_RDI + 0x40);
  count = local_18;
  Span<const_unsigned_char>::first
            ((Span<const_unsigned_char> *)in_stack_ffffffffffffff98,(size_t)count);
  input.m_data._4_4_ = in_stack_ffffffffffffffa4;
  input.m_data._0_4_ = in_stack_ffffffffffffffa0;
  input.m_size = in_stack_ffffffffffffffa8;
  CHash256::Write((CHash256 *)in_stack_ffffffffffffff98,input);
  __dest = DataStream::operator[](in_stack_ffffffffffffff98,(size_type)count);
  __src = Span<const_unsigned_char>::data(this_00);
  memcpy(__dest,__src,(ulong)uVar1);
  *(uint *)(in_RDI + 300) = *(int *)(in_RDI + 300) + uVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return uVar1;
  }
  __stack_chk_fail();
}

Assistant:

int V1Transport::readData(Span<const uint8_t> msg_bytes)
{
    AssertLockHeld(m_recv_mutex);
    unsigned int nRemaining = hdr.nMessageSize - nDataPos;
    unsigned int nCopy = std::min<unsigned int>(nRemaining, msg_bytes.size());

    if (vRecv.size() < nDataPos + nCopy) {
        // Allocate up to 256 KiB ahead, but never more than the total message size.
        vRecv.resize(std::min(hdr.nMessageSize, nDataPos + nCopy + 256 * 1024));
    }

    hasher.Write(msg_bytes.first(nCopy));
    memcpy(&vRecv[nDataPos], msg_bytes.data(), nCopy);
    nDataPos += nCopy;

    return nCopy;
}